

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

void __thiscall FMapInfoParser::ParseDamageDefinition(FMapInfoParser *this)

{
  bool bVar1;
  int iVar2;
  Node *pNVar3;
  bool bVar4;
  bool bVar5;
  double local_40;
  FName local_34;
  
  FScanner::MustGetString(&this->sc);
  bVar4 = false;
  iVar2 = FName::NameManager::FindName(&FName::NameData,(this->sc).String,false);
  ParseOpenBrace(this);
  FScanner::MustGetAnyToken(&this->sc);
  if ((this->sc).TokenType == 0x7d) {
    local_40 = 1.0;
    bVar5 = false;
  }
  else {
    local_40 = 1.0;
    bVar5 = false;
    bVar4 = false;
    do {
      bVar1 = FScanner::Compare(&this->sc,"FACTOR");
      if (bVar1) {
        FScanner::MustGetStringName(&this->sc,"=");
        FScanner::MustGetFloat(&this->sc);
        local_40 = (this->sc).Float;
        if ((local_40 == 0.0) && (!NAN(local_40))) {
LAB_0039e71c:
          bVar4 = true;
        }
      }
      else {
        bVar1 = FScanner::Compare(&this->sc,"REPLACEFACTOR");
        if (bVar1) goto LAB_0039e71c;
        bVar1 = FScanner::Compare(&this->sc,"NOARMOR");
        if (bVar1) {
          bVar5 = true;
        }
        else {
          FScanner::ScriptError
                    (&this->sc,"Unexpected data (%s) in damagetype definition.",(this->sc).String);
        }
      }
      FScanner::MustGetAnyToken(&this->sc);
    } while ((this->sc).TokenType != 0x7d);
  }
  local_34.Index = iVar2;
  pNVar3 = TMap<FName,_DamageTypeDefinition,_THashTraits<FName>,_TValueTraits<DamageTypeDefinition>_>
           ::GetNode(&GlobalDamageDefinitions,&local_34);
  (pNVar3->Pair).Value.DefaultFactor = local_40;
  (pNVar3->Pair).Value.ReplaceFactor = bVar4;
  (pNVar3->Pair).Value.NoArmor = bVar5;
  return;
}

Assistant:

void FMapInfoParser::ParseDamageDefinition()
{
	sc.MustGetString();
	FName damageType = sc.String;

	DamageTypeDefinition dtd;

	ParseOpenBrace();
	while (sc.MustGetAnyToken(), sc.TokenType != '}')
	{
		if (sc.Compare("FACTOR"))
		{
			sc.MustGetStringName("=");
			sc.MustGetFloat();
			dtd.DefaultFactor = sc.Float;
			if (dtd.DefaultFactor == 0) dtd.ReplaceFactor = true;
		}
		else if (sc.Compare("REPLACEFACTOR"))
		{
			dtd.ReplaceFactor = true;
		}
		else if (sc.Compare("NOARMOR"))
		{
			dtd.NoArmor = true;
		}
		else
		{
			sc.ScriptError("Unexpected data (%s) in damagetype definition.", sc.String);
		}
	}

	dtd.Apply(damageType);
}